

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedTransaction.cpp
# Opt level: O0

void __thiscall f8n::db::ScopedTransaction::End(ScopedTransaction *this)

{
  ScopedTransaction *this_local;
  
  this->connection->transactionCounter = this->connection->transactionCounter + -1;
  if (this->connection->transactionCounter == 0) {
    if ((this->canceled & 1U) == 0) {
      Connection::Execute(this->connection,"COMMIT TRANSACTION");
    }
    else {
      Connection::Execute(this->connection,"ROLLBACK TRANSACTION");
    }
  }
  this->canceled = false;
  return;
}

Assistant:

void ScopedTransaction::End() {
    --this->connection->transactionCounter;

    if (this->connection->transactionCounter == 0) {
        if (this->canceled) {
            this->connection->Execute("ROLLBACK TRANSACTION");
        }
        else {
            this->connection->Execute("COMMIT TRANSACTION");
            //this->connection->Checkpoint();
        }
    }

    this->canceled = false;
}